

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::CheckErrors(CLzmaEnc *p)

{
  CLzmaEnc *p_local;
  SRes local_4;
  
  if (p->result == 0) {
    if ((p->rc).res != 0) {
      p->result = 9;
    }
    if ((p->matchFinderBase).result != 0) {
      p->result = 8;
    }
    if (p->result != 0) {
      p->finished = 1;
    }
    local_4 = p->result;
  }
  else {
    local_4 = p->result;
  }
  return local_4;
}

Assistant:

static SRes CheckErrors(CLzmaEnc* p) {
  if (p->result != SZ_OK)
    return p->result;
  if (p->rc.res != SZ_OK)
    p->result = SZ_ERROR_WRITE;
  if (p->matchFinderBase.result != SZ_OK)
    p->result = SZ_ERROR_READ;
  if (p->result != SZ_OK)
    p->finished = True;
  return p->result;
}